

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O0

void __thiscall AsyncRgbLedAnalyzer::SetupResults(AsyncRgbLedAnalyzer *this)

{
  AsyncRgbLedAnalyzerResults *this_00;
  pointer settings;
  pointer pAVar1;
  AsyncRgbLedAnalyzer *this_local;
  
  this_00 = (AsyncRgbLedAnalyzerResults *)operator_new(0x20);
  settings = std::
             unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
             ::get(&this->mSettings);
  AsyncRgbLedAnalyzerResults::AsyncRgbLedAnalyzerResults(this_00,this,settings);
  std::unique_ptr<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>::
  reset(&this->mResults,this_00);
  std::unique_ptr<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>::get
            (&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  pAVar1 = std::
           unique_ptr<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
           ::operator->(&this->mResults);
  std::unique_ptr<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>::
  operator->(&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)pAVar1);
  return;
}

Assistant:

void AsyncRgbLedAnalyzer::SetupResults()
{
    mResults.reset( new AsyncRgbLedAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}